

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O1

TapBranch * cfd::core::TapBranch::FromString(TapBranch *__return_storage_ptr__,string *text)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  CfdException *pCVar4;
  byte bVar5;
  string *extraout_RDX;
  string *extraout_RDX_00;
  string *extraout_RDX_01;
  string *extraout_RDX_02;
  string *extraout_RDX_03;
  string *extraout_RDX_04;
  string *extraout_RDX_05;
  string *psVar6;
  Script *pSVar7;
  TapBranch *__return_storage_ptr___00;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  text_list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> head;
  TapBranch branch2;
  ulong local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  TapBranch local_128;
  ulong local_b0;
  TapBranch local_a8;
  
  lVar2 = ::std::__cxx11::string::find((char)text,0x20);
  if (lVar2 != -1) {
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_128._vptr_TapBranch = (_func_int **)&local_128.script_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"Contains invalid charactor.","");
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_128);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  TapBranch(__return_storage_ptr__);
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = text->_M_string_length;
  psVar6 = extraout_RDX;
  if (uVar3 == 0) {
    uVar8 = 1;
    uVar3 = 0;
  }
  else {
    bVar9 = 0;
    uVar8 = 0;
    uVar11 = 0;
    local_150 = 0;
    local_b0 = 0;
    do {
      pSVar7 = &local_128.script_;
      bVar5 = (text->_M_dataplus)._M_p[uVar11];
      uVar10 = local_b0;
      if (bVar5 == 0x7d) {
        if (bVar9 == 0) {
          pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
          local_128._vptr_TapBranch = (_func_int **)pSVar7;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_128,"Invalid tree format.","");
          CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_128);
          __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
        }
        bVar9 = bVar9 - 1;
        if (bVar9 == 0) {
          if (local_150 == 0) {
            pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
            local_128._vptr_TapBranch = (_func_int **)pSVar7;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"Invalid tree format. empty split block.","");
            CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_128);
            __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
          }
          if (uVar11 <= local_150) {
            pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
            local_128._vptr_TapBranch = (_func_int **)pSVar7;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"Invalid tree item.","");
            CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_128);
            __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
          }
          ::std::__cxx11::string::substr((ulong)&local_128,(ulong)text);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_148
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_128);
          psVar6 = extraout_RDX_00;
          uVar10 = uVar11;
          if ((Script *)local_128._vptr_TapBranch != pSVar7) {
            operator_delete(local_128._vptr_TapBranch);
            psVar6 = extraout_RDX_01;
          }
        }
      }
      else if (bVar5 == 0x7b) {
        if (bVar9 == 0) {
          uVar8 = uVar11 + 1;
        }
        bVar9 = bVar9 + 1;
        if (bVar9 == 0xff) {
          pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
          local_128._vptr_TapBranch = (_func_int **)pSVar7;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_128,"Invalid tree format.","");
          CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_128);
          __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
        }
      }
      else {
        bVar5 = bVar9 ^ 1 | bVar5 ^ 0x2c;
        psVar6 = (string *)(ulong)bVar5;
        if (bVar5 == 0) {
          uVar10 = local_150;
          if (local_150 == 0) {
            uVar10 = uVar8;
          }
          if (uVar10 + 3 < uVar3) {
            ::std::__cxx11::string::substr((ulong)&local_128,(ulong)text);
            if (uVar11 == 0) {
              bVar12 = true;
            }
            else {
              bVar12 = (text->_M_dataplus)._M_p[uVar11 - 1] != ')';
            }
            iVar1 = ::std::__cxx11::string::compare((char *)&local_128);
            psVar6 = extraout_RDX_02;
            if ((Script *)local_128._vptr_TapBranch != &local_128.script_) {
              operator_delete(local_128._vptr_TapBranch);
              psVar6 = extraout_RDX_03;
            }
            uVar10 = local_b0;
            if ((bool)(iVar1 == 0 & bVar12)) goto LAB_0046cba7;
          }
          if (local_150 != 0) {
            pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
            local_128._vptr_TapBranch = (_func_int **)&local_128.script_;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"Invalid tree splitformat.","");
            CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_128);
            __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
          }
          ::std::__cxx11::string::substr((ulong)&local_128,(ulong)text);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_148
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_128);
          psVar6 = extraout_RDX_04;
          if ((Script *)local_128._vptr_TapBranch != &local_128.script_) {
            operator_delete(local_128._vptr_TapBranch);
            psVar6 = extraout_RDX_05;
          }
          local_150 = uVar11 + 1;
          uVar10 = local_b0;
        }
      }
LAB_0046cba7:
      local_b0 = uVar10;
      uVar11 = uVar11 + 1;
      uVar3 = text->_M_string_length;
    } while (uVar11 < uVar3);
    uVar8 = local_b0 + 1;
  }
  if (local_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (((long)local_148.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_148.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start != 0x40) || (uVar8 < uVar3)) {
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_128._vptr_TapBranch = (_func_int **)&local_128.script_;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,"Invalid tree format.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_128);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    psVar6 = (string *)0x40;
    if (local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __return_storage_ptr___00 = &local_128;
      FromString::anon_class_1_0_00000001::operator()
                (__return_storage_ptr___00,
                 (anon_class_1_0_00000001 *)
                 local_148.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,(string *)0x40);
      psVar6 = (string *)
               ((long)local_148.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_148.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5);
      if (psVar6 < (string *)0x2) {
        ::std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
      }
      FromString::anon_class_1_0_00000001::operator()
                (&local_a8,
                 (anon_class_1_0_00000001 *)
                 (local_148.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1),psVar6);
      if ((local_128.has_leaf_ == false) && (local_a8.has_leaf_ == true)) {
        AddBranch(&local_a8,&local_128);
        __return_storage_ptr___00 = &local_a8;
      }
      else {
        AddBranch(__return_storage_ptr___00,&local_a8);
      }
      operator=(__return_storage_ptr__,__return_storage_ptr___00);
      ~TapBranch(&local_a8);
      goto LAB_0046cc9e;
    }
  }
  FromString::anon_class_1_0_00000001::operator()(&local_128,(anon_class_1_0_00000001 *)text,psVar6)
  ;
  operator=(__return_storage_ptr__,&local_128);
LAB_0046cc9e:
  ~TapBranch(&local_128);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  return __return_storage_ptr__;
}

Assistant:

TapBranch TapBranch::FromString(const std::string& text) {
  static auto check_tapleaf_func = [](const std::string& text,
                                      TapBranch* branch) -> bool {
    if (text.size() < 6) return false;
    std::string head = text.substr(0, 3);
    if ((head == "tl(") && (*(text.end() - 1) == ')')) {
      size_t leaf_ver_offset = text.find(',');
      if (leaf_ver_offset == std::string::npos) {
        *branch = TaprootScriptTree(Script(text.substr(3, text.length() - 4)));
      } else {
        auto script_str = text.substr(3, leaf_ver_offset - 3);
        auto leaf_ver_str = text.substr(leaf_ver_offset + 1, 2);
        char* err = nullptr;
        auto leaf_version = strtol(leaf_ver_str.c_str(), &err, 16);
        if (((err != nullptr) && (*err != '\0')) || (leaf_version < 0) ||
            (leaf_version > std::numeric_limits<uint8_t>::max())) {
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Invalid leaf version.");
        }
        *branch = TaprootScriptTree(
            static_cast<uint8_t>(leaf_version), Script(script_str));
      }
      return true;
    }
    return false;
  };

  static auto analyze_func = [](const std::string& target) -> TapBranch {
    TapBranch result;
    if (*target.begin() == '{') {
      result = TapBranch::FromString(target);  // analyze branch
    } else if (!check_tapleaf_func(target, &result)) {
      result = TapBranch(ByteData256(target));
    }
    return result;
  };

  static auto collect_items_func =
      [](const std::string& text) -> std::vector<std::string> {
    std::vector<std::string> result;
    uint8_t depth = 0;
    size_t start_block_index = 0;
    size_t end_block_index = 0;
    size_t split_index = 0;
    for (size_t idx = 0; idx < text.size(); ++idx) {
      const char& str = text[idx];
      if (str == '{') {
        if (depth == 0) start_block_index = idx + 1;
        ++depth;
        if (depth == std::numeric_limits<uint8_t>::max()) {
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Invalid tree format.");
        }
      } else if (str == '}') {
        if (depth == 0) {
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Invalid tree format.");
        }
        --depth;
        if (depth == 0) {
          if (split_index == 0) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "Invalid tree format. empty split block.");
          }
          end_block_index = idx;
          size_t offset = (split_index == 0) ? start_block_index : split_index;
          if (end_block_index <= offset) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError, "Invalid tree item.");
          }
          result.emplace_back(text.substr(offset, idx - offset));
        }
      } else if (str == ',') {
        if (depth == 1) {
          size_t offset = (split_index == 0) ? start_block_index : split_index;
          if ((offset + 3) < text.size()) {
            auto head = text.substr(offset, 3);
            char prev_str = 0;
            if (idx > 0) prev_str = text[idx - 1];
            // ignore leaf ver
            if ((head == "tl(") && (prev_str != ')')) continue;
          }

          if (split_index != 0) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "Invalid tree splitformat.");
          }
          result.emplace_back(text.substr(offset, idx - offset));
          split_index = idx + 1;
        }
      }
    }

    if (result.empty()) {
      // do nothing
    } else if ((result.size() != 2) || ((end_block_index + 1) < text.size())) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Invalid tree format.");
    }
    return result;
  };

  if (text.find(' ') != std::string::npos) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Contains invalid charactor.");
  }

  TapBranch result;
  auto text_list = collect_items_func(text);
  if (text_list.empty()) {
    result = analyze_func(text);
  } else {
    auto branch1 = analyze_func(text_list.at(0));
    auto branch2 = analyze_func(text_list.at(1));
    if ((!branch1.has_leaf_) && (branch2.has_leaf_)) {
      branch2.AddBranch(branch1);
      result = branch2;
    } else {
      branch1.AddBranch(branch2);
      result = branch1;
    }
  }

  return result;
}